

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall Thread::setDefaultName(Thread *this)

{
  char local_48 [8];
  char buf [32];
  
  if ((this->name_)._M_string_length == 0) {
    builtin_strncpy(local_48,"Thread",7);
    strlen(local_48);
    std::__cxx11::string::_M_replace((ulong)&this->name_,0,(char *)0x0,(ulong)local_48);
  }
  return;
}

Assistant:

void Thread::setDefaultName() {
    if(name_.empty()){
        char buf[32];
        snprintf(buf, sizeof(buf), "Thread");
        name_ = buf;
    }
}